

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecMult.c
# Opt level: O3

word Extra_TruthCanonNPN3(word uTruth,int nVars,Vec_Wrd_t *vRes)

{
  size_t __size;
  int iVar1;
  byte bVar2;
  bool bVar3;
  bool bVar4;
  uint uVar5;
  int *__ptr;
  int *__ptr_00;
  word *pwVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  uint uVar14;
  uint uVar15;
  
  uVar14 = 1 << ((byte)nVars & 0x1f);
  uVar5 = Extra_Factorial(nVars);
  __ptr = Extra_GreyCodeSchedule(nVars);
  __ptr_00 = Extra_PermSchedule(nVars);
  if ((int)uVar14 < 2) {
    uVar14 = 1;
  }
  vRes->nSize = 0;
  uVar12 = 0xffffffffffffffff;
  bVar4 = true;
  uVar15 = 0;
  uVar11 = 0;
  do {
    if (0 < (int)uVar5) {
      uVar9 = 0;
      uVar10 = uVar11 ^ uTruth;
      do {
        uVar7 = uVar10;
        if (nVars != 0x1f) {
          uVar13 = 0;
          do {
            if (uVar7 <= uVar12) {
              uVar12 = uVar7;
            }
            if (0 < (int)uVar15) {
              uVar8 = 0;
              do {
                if (vRes->pArray[uVar8] == uVar7) goto LAB_0067e51b;
                uVar8 = uVar8 + 1;
              } while (uVar15 != uVar8);
            }
            if (uVar15 == vRes->nCap) {
              if ((int)uVar15 < 0x10) {
                if (vRes->pArray == (word *)0x0) {
                  pwVar6 = (word *)malloc(0x80);
                }
                else {
                  pwVar6 = (word *)realloc(vRes->pArray,0x80);
                }
                vRes->pArray = pwVar6;
                if (pwVar6 == (word *)0x0) {
LAB_0067e5f2:
                  __assert_fail("p->pArray",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWrd.h"
                                ,0x205,"void Vec_WrdGrow(Vec_Wrd_t *, int)");
                }
                vRes->nCap = 0x10;
              }
              else {
                __size = (ulong)(uVar15 * 2) * 8;
                if (vRes->pArray == (word *)0x0) {
                  pwVar6 = (word *)malloc(__size);
                }
                else {
                  pwVar6 = (word *)realloc(vRes->pArray,__size);
                }
                vRes->pArray = pwVar6;
                if (pwVar6 == (word *)0x0) goto LAB_0067e5f2;
                vRes->nCap = uVar15 * 2;
              }
            }
            else {
              pwVar6 = vRes->pArray;
            }
            iVar1 = vRes->nSize;
            uVar15 = iVar1 + 1;
            vRes->nSize = uVar15;
            pwVar6[iVar1] = uVar7;
LAB_0067e51b:
            bVar2 = (byte)(1L << ((byte)__ptr[uVar13] & 0x3f));
            uVar7 = (s_Truths6[__ptr[uVar13]] & uVar7) >> (bVar2 & 0x3f) |
                    uVar7 << (bVar2 & 0x3f) & s_Truths6[__ptr[uVar13]];
            uVar13 = uVar13 + 1;
          } while (uVar13 != uVar14);
        }
        if (uVar10 != uVar7) {
          __assert_fail("tTemp2 == tCur",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/acec/acecMult.c"
                        ,0xb9,"word Extra_TruthCanonNPN3(word, int, Vec_Wrd_t *)");
        }
        iVar1 = __ptr_00[uVar9];
        bVar2 = (byte)(1L << ((byte)iVar1 & 0x3f));
        uVar10 = (uVar10 & s_PMasks[iVar1][2]) >> (bVar2 & 0x3f) |
                 (s_PMasks[iVar1][1] & uVar10) << (bVar2 & 0x3f) | s_PMasks[iVar1][0] & uVar10;
        uVar9 = uVar9 + 1;
      } while (uVar9 != uVar5);
      if ((uVar11 ^ uTruth) != uVar10) {
        __assert_fail("tTemp1 == tCur",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/acec/acecMult.c"
                      ,0xbc,"word Extra_TruthCanonNPN3(word, int, Vec_Wrd_t *)");
      }
    }
    uVar11 = 0xffffffffffffffff;
    bVar3 = !bVar4;
    bVar4 = false;
    if (bVar3) {
      if (__ptr != (int *)0x0) {
        free(__ptr);
      }
      if (__ptr_00 != (int *)0x0) {
        free(__ptr_00);
      }
      return uVar12;
    }
  } while( true );
}

Assistant:

word Extra_TruthCanonNPN3( word uTruth, int nVars, Vec_Wrd_t * vRes )
{
    int nMints  = (1 << nVars);
    int nPerms  = Extra_Factorial( nVars );
    int * pComp = Extra_GreyCodeSchedule( nVars );
    int * pPerm = Extra_PermSchedule( nVars );
    word tCur, tTemp1, tTemp2;
    word uTruthMin = ABC_CONST(0xFFFFFFFFFFFFFFFF);
    int i, p, c;
    Vec_WrdClear( vRes );
    for ( i = 0; i < 2; i++ )
    {
        tCur = i ? ~uTruth : uTruth;
        tTemp1 = tCur;
        for ( p = 0; p < nPerms; p++ )
        {
            tTemp2 = tCur;
            for ( c = 0; c < nMints; c++ )
            {
                if ( uTruthMin > tCur )
                    uTruthMin = tCur;
                Vec_WrdPushUnique( vRes, tCur );
                tCur = Abc_Tt6Flip( tCur, pComp[c] );
            }
            assert( tTemp2 == tCur );
            tCur = Abc_Tt6SwapAdjacent( tCur, pPerm[p] );
        }
        assert( tTemp1 == tCur );
    }
    ABC_FREE( pComp );
    ABC_FREE( pPerm );
    return uTruthMin;
}